

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_plane.cpp
# Opt level: O2

bool __thiscall ON_Plane::Flip(ON_Plane *this)

{
  double dVar1;
  double dVar2;
  double dVar3;
  double dVar4;
  ON_3dVector v;
  ON_3dVector local_28;
  
  dVar1 = (this->xaxis).z;
  dVar2 = (this->xaxis).x;
  dVar3 = (this->xaxis).y;
  dVar4 = (this->yaxis).y;
  (this->xaxis).x = (this->yaxis).x;
  (this->xaxis).y = dVar4;
  (this->xaxis).z = (this->yaxis).z;
  (this->yaxis).x = dVar2;
  (this->yaxis).y = dVar3;
  (this->yaxis).z = dVar1;
  ON_3dVector::operator-(&local_28,&this->zaxis);
  (this->zaxis).z = local_28.z;
  (this->zaxis).x = local_28.x;
  (this->zaxis).y = local_28.y;
  UpdateEquation(this);
  return true;
}

Assistant:

bool ON_Plane::Flip()
{
  ON_3dVector v = xaxis;
  xaxis = yaxis;
  yaxis = v;
  zaxis = -zaxis;
  UpdateEquation();
  return true;
}